

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS.h
# Opt level: O0

tuple<N_*> __thiscall NS::wrap<int>(NS *this,int item)

{
  N **__args;
  N *in_RDI;
  _Head_base<0UL,_N_*,_false> _Var1;
  size_t in_stack_ffffffffffffffe0;
  
  _Var1._M_head_impl = in_RDI;
  __args = (N **)N::operator_new(in_stack_ffffffffffffffe0,(NS *)in_RDI);
  N::N<int>(in_RDI,(int)((ulong)__args >> 0x20));
  std::make_tuple<N*>(__args);
  return (tuple<N_*>)_Var1._M_head_impl;
}

Assistant:

std::tuple<N*> wrap(DataType item) {
        return std::make_tuple(new(this) N(item));
    }